

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O2

StringPtr __thiscall
capnp::anon_unknown_1::CapnpcCppMain::protoName<capnp::schema::Method::Reader>
          (CapnpcCppMain *this,Reader proto)

{
  uint64_t in_RDX;
  ArrayPtr<const_char> AVar1;
  NullableValue<capnp::schema::Value::Reader> _name576;
  Maybe<capnp::schema::Value::Reader> local_78;
  char local_40;
  Reader local_38;
  
  annotationValue<capnp::schema::Method::Reader>
            (&local_78,(CapnpcCppMain *)0xf264a779fef191ce,proto,in_RDX);
  local_40 = local_78.ptr.isSet;
  if (local_78.ptr.isSet == true) {
    local_38._reader.dataSize = local_78.ptr.field_1.value._reader.dataSize;
    local_38._reader.pointerCount = local_78.ptr.field_1.value._reader.pointerCount;
    local_38._reader._38_2_ = local_78.ptr.field_1._38_2_;
    local_38._reader._40_8_ = local_78.ptr.field_1._40_8_;
    local_38._reader.data = local_78.ptr.field_1.value._reader.data;
    local_38._reader.pointers = local_78.ptr.field_1.value._reader.pointers;
    local_38._reader.segment = local_78.ptr.field_1.value._reader.segment;
    local_38._reader.capTable = local_78.ptr.field_1.value._reader.capTable;
    AVar1 = (ArrayPtr<const_char>)capnp::schema::Value::Reader::getText(&local_38);
  }
  else {
    AVar1 = (ArrayPtr<const_char>)capnp::schema::Method::Reader::getName(&proto);
  }
  return (StringPtr)AVar1;
}

Assistant:

kj::StringPtr protoName(P proto) {
    KJ_IF_SOME(name, annotationValue(proto, NAME_ANNOTATION_ID)) {
      return name.getText();
    } else {
      return proto.getName();
    }
  }